

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTasks.cpp
# Opt level: O0

Expression * __thiscall
slang::ast::builtins::SdfAnnotateTask::bindArgument
          (SdfAnnotateTask *this,size_t argIndex,ASTContext *context,ExpressionSyntax *syntax,
          Args *args)

{
  SourceRange sourceRange;
  SourceRange sourceRange_00;
  bool bVar1;
  InvalidExpression *pIVar2;
  NameSyntax *args_00;
  Symbol *pSVar3;
  Expression *pEVar4;
  SyntaxNode *in_RCX;
  ASTContext *in_RDX;
  long in_RSI;
  SourceLocation in_RDI;
  Symbol *sym;
  Expression *ref;
  Compilation *comp;
  ASTContext *in_stack_00000260;
  NameSyntax *in_stack_00000268;
  Compilation *in_stack_00000270;
  bitmask<slang::ast::LookupFlags> in_stack_0000027c;
  Type *in_stack_ffffffffffffff40;
  Compilation *args_1;
  void **in_stack_ffffffffffffff48;
  Args *in_stack_ffffffffffffff50;
  ASTContext *this_00;
  ASTContext *in_stack_ffffffffffffff58;
  SourceLocation in_stack_ffffffffffffff60;
  SystemSubroutine *in_stack_ffffffffffffff70;
  DiagCode code;
  Scope *in_stack_ffffffffffffff78;
  SyntaxNode *in_stack_ffffffffffffff90;
  bitmask<slang::ast::LookupFlags> local_64;
  InvalidExpression *local_60;
  undefined8 local_58;
  SourceRange local_50;
  undefined4 local_3c;
  Compilation *local_38;
  SyntaxNode *local_28;
  ASTContext *local_20;
  InvalidExpression *local_8;
  
  if (in_RSI != 1) {
    pEVar4 = SystemSubroutine::bindArgument
                       (in_stack_ffffffffffffff70,(size_t)in_RDI,
                        (ASTContext *)in_stack_ffffffffffffff60,
                        (ExpressionSyntax *)in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
    return pEVar4;
  }
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_38 = ASTContext::getCompilation((ASTContext *)0x99d688);
  code = SUB84((ulong)in_stack_ffffffffffffff70 >> 0x20,0);
  bVar1 = slang::syntax::NameSyntax::isKind(local_28->kind);
  if (!bVar1) {
    local_3c = 0xa000b;
    local_50 = slang::syntax::SyntaxNode::sourceRange(in_stack_ffffffffffffff90);
    sourceRange.endLoc = in_RDI;
    sourceRange.startLoc = in_stack_ffffffffffffff60;
    ASTContext::addDiag(local_20,code,sourceRange);
    local_58 = 0;
    Compilation::getErrorType(local_38);
    pIVar2 = BumpAllocator::
             emplace<slang::ast::InvalidExpression,decltype(nullptr),slang::ast::Type_const&>
                       ((BumpAllocator *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
                        in_stack_ffffffffffffff40);
    return &pIVar2->super_Expression;
  }
  args_1 = local_38;
  args_00 = slang::syntax::SyntaxNode::as<slang::syntax::NameSyntax>(local_28);
  memset(&local_64,0,4);
  bitmask<slang::ast::LookupFlags>::bitmask(&local_64);
  local_60 = (InvalidExpression *)
             ArbitrarySymbolExpression::fromSyntax
                       (in_stack_00000270,in_stack_00000268,in_stack_00000260,in_stack_0000027c);
  if ((local_60->super_Expression).kind == ArbitrarySymbol) {
    Expression::as<slang::ast::ArbitrarySymbolExpression>((Expression *)local_60);
    pSVar3 = not_null<const_slang::ast::Symbol_*>::operator*
                       ((not_null<const_slang::ast::Symbol_*> *)0x99d7c3);
    this_00 = local_20;
    if (pSVar3->kind == Instance) {
      Symbol::as<slang::ast::InstanceSymbol>((Symbol *)0x99d7dc);
      bVar1 = InstanceSymbol::isModule((InstanceSymbol *)0x99d7e4);
      this_00 = local_20;
      if (bVar1) goto LAB_0099d881;
    }
    not_null<const_slang::ast::Scope_*>::operator->((not_null<const_slang::ast::Scope_*> *)0x99d7f9)
    ;
    bVar1 = Scope::isUninstantiated(in_stack_ffffffffffffff78);
    if (!bVar1) {
      sourceRange_00.endLoc = in_RDI;
      sourceRange_00.startLoc = in_stack_ffffffffffffff60;
      ASTContext::addDiag(in_stack_ffffffffffffff58,code,sourceRange_00);
    }
    Compilation::getErrorType(local_38);
    local_8 = BumpAllocator::
              emplace<slang::ast::InvalidExpression,slang::ast::Expression*,slang::ast::Type_const&>
                        ((BumpAllocator *)this_00,(Expression **)args_00,(Type *)args_1);
  }
  else {
LAB_0099d881:
    local_8 = local_60;
  }
  return &local_8->super_Expression;
}

Assistant:

const Expression& bindArgument(size_t argIndex, const ASTContext& context,
                                   const ExpressionSyntax& syntax, const Args& args) const final {
        if (argIndex == 1) {
            auto& comp = context.getCompilation();
            if (!NameSyntax::isKind(syntax.kind)) {
                context.addDiag(diag::ExpectedModuleInstance, syntax.sourceRange());
                return *comp.emplace<InvalidExpression>(nullptr, comp.getErrorType());
            }

            auto& ref = ArbitrarySymbolExpression::fromSyntax(comp, syntax.as<NameSyntax>(),
                                                              context);

            if (ref.kind == ExpressionKind::ArbitrarySymbol) {
                auto& sym = *ref.as<ArbitrarySymbolExpression>().symbol;
                if (sym.kind != SymbolKind::Instance || !sym.as<InstanceSymbol>().isModule()) {
                    if (!context.scope->isUninstantiated())
                        context.addDiag(diag::ExpectedModuleInstance, ref.sourceRange);
                    return *comp.emplace<InvalidExpression>(&ref, comp.getErrorType());
                }
            }

            return ref;
        }

        return SystemTaskBase::bindArgument(argIndex, context, syntax, args);
    }